

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  undefined4 extraout_var;
  ulong uVar5;
  long lVar6;
  stbi_uc sVar7;
  stbi_uc *psVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  undefined1 local_a2c [8];
  stbi__zhuffman z_codelength;
  stbi_uc lencodes [455];
  stbi_uc local_78 [24];
  ulong local_60;
  uint local_54;
  stbi__zhuffman *local_50;
  stbi__zhuffman *local_48;
  ulong local_40;
  int local_34;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0011d72b:
    a->num_bits = 0;
    a->code_buffer = 0;
    local_50 = &a->z_length;
    local_48 = &a->z_distance;
    do {
      local_54 = stbi__zreceive(a,1);
      uVar1 = stbi__zreceive(a,2);
      if (uVar1 == 0) {
        uVar1 = a->num_bits;
        if ((uVar1 & 7) != 0) {
          stbi__zreceive(a,uVar1 & 7);
          uVar1 = a->num_bits;
        }
        uVar5 = 0;
        while (0 < (int)uVar1) {
          uVar2 = a->code_buffer;
          local_a2c[uVar5] = (char)uVar2;
          uVar5 = uVar5 + 1;
          a->code_buffer = uVar2 >> 8;
          uVar1 = uVar1 - 8;
          a->num_bits = uVar1;
        }
        if (uVar1 != 0) {
          __assert_fail("a->num_bits == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                        ,0xe8d,"int stbi__parse_uncomperssed_block(stbi__zbuf *)");
        }
        for (; uVar5 < 4; uVar5 = uVar5 + 1) {
          psVar8 = a->zbuffer;
          if (psVar8 < a->zbuffer_end) {
            a->zbuffer = psVar8 + 1;
            sVar7 = *psVar8;
          }
          else {
            sVar7 = '\0';
          }
          local_a2c[uVar5] = sVar7;
        }
        if ((local_a2c._2_2_ ^ local_a2c._0_2_) != 0xffff) {
          stbi__g_failure_reason = "zlib corrupt";
          goto LAB_0011dc85;
        }
        psVar8 = a->zbuffer;
        uVar5 = (ulong)(ushort)local_a2c._0_2_;
        if (a->zbuffer_end < psVar8 + uVar5) {
          stbi__g_failure_reason = "read past buffer";
          goto LAB_0011dc85;
        }
        pcVar10 = a->zout;
        if (a->zout_end < pcVar10 + uVar5) {
          iVar3 = stbi__zexpand(a,pcVar10,(uint)(ushort)local_a2c._0_2_);
          if (iVar3 == 0) {
            return 0;
          }
          psVar8 = a->zbuffer;
          pcVar10 = a->zout;
        }
        memcpy(pcVar10,psVar8,uVar5);
        a->zbuffer = a->zbuffer + uVar5;
        a->zout = a->zout + uVar5;
      }
      else {
        if (uVar1 == 1) {
          if (stbi__zdefault_distance[0x1f] == '\0') {
            for (lVar6 = 0; lVar6 != 0x90; lVar6 = lVar6 + 1) {
              stbi__zdefault_length[lVar6] = '\b';
            }
            for (lVar6 = 0; lVar6 != 0x70; lVar6 = lVar6 + 1) {
              stbi__zdefault_length[lVar6 + 0x90] = '\t';
            }
            for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 1) {
              stbi__zdefault_length[lVar6 + 0x100] = '\a';
            }
            for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
              stbi__zdefault_length[lVar6 + 0x118] = '\b';
            }
            for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
              stbi__zdefault_distance[lVar6] = '\x05';
            }
          }
          iVar3 = stbi__zbuild_huffman(local_50,stbi__zdefault_length,0x120);
          if (iVar3 == 0) {
            return 0;
          }
          iVar3 = stbi__zbuild_huffman(local_48,stbi__zdefault_distance,0x20);
          if (iVar3 == 0) {
            return 0;
          }
        }
        else {
          if (uVar1 == 3) {
            return 0;
          }
          uVar1 = stbi__zreceive(a,5);
          uVar2 = stbi__zreceive(a,5);
          local_40 = CONCAT44(extraout_var,uVar2);
          uVar2 = stbi__zreceive(a,4);
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          local_78[4] = '\0';
          local_78[5] = '\0';
          local_78[6] = '\0';
          local_78[7] = '\0';
          local_78[8] = '\0';
          local_78[9] = '\0';
          local_78[10] = '\0';
          local_78[0xb] = '\0';
          local_78[0xc] = '\0';
          local_78[0xd] = '\0';
          local_78[0xe] = '\0';
          local_78[0xf] = '\0';
          local_78[0x10] = '\0';
          local_78[0x11] = '\0';
          local_78[0x12] = '\0';
          uVar5 = (ulong)(uVar2 + 4);
          if ((int)(uVar2 + 4) < 1) {
            uVar5 = 0;
          }
          for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
            uVar2 = stbi__zreceive(a,3);
            local_78[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar11]] =
                 (stbi_uc)uVar2;
          }
          iVar3 = stbi__zbuild_huffman((stbi__zhuffman *)local_a2c,local_78,0x13);
          if (iVar3 == 0) {
            return 0;
          }
          local_60 = (ulong)(uVar1 + 0x101);
          uVar2 = (int)local_40 + 1;
          local_40 = (ulong)uVar2;
          local_34 = uVar2 + uVar1 + 0x101;
          iVar3 = local_34;
          iVar9 = 0;
          while( true ) {
            if (iVar3 <= iVar9) break;
            uVar1 = stbi__zhuffman_decode(a,(stbi__zhuffman *)local_a2c);
            if (0x12 < uVar1) goto LAB_0011dc62;
            if (uVar1 < 0x10) {
              lencodes[(long)iVar9 + -8] = (stbi_uc)uVar1;
              iVar9 = iVar9 + 1;
            }
            else {
              psVar8 = lencodes + (long)iVar9 + -8;
              if (uVar1 == 0x11) {
                uVar1 = stbi__zreceive(a,3);
                memset(psVar8,0,(long)(int)(uVar1 + 3));
                iVar9 = iVar9 + uVar1 + 3;
                iVar3 = local_34;
              }
              else if (uVar1 == 0x10) {
                uVar1 = stbi__zreceive(a,2);
                memset(psVar8,(uint)lencodes[(long)iVar9 + -9],(long)(int)(uVar1 + 3));
                iVar9 = iVar9 + uVar1 + 3;
                iVar3 = local_34;
              }
              else {
                uVar1 = stbi__zreceive(a,7);
                memset(psVar8,0,(long)(int)(uVar1 + 0xb));
                iVar9 = iVar9 + uVar1 + 0xb;
                iVar3 = local_34;
              }
            }
          }
          if (iVar9 != iVar3) {
LAB_0011dc62:
            stbi__g_failure_reason = "bad codelengths";
            return 0;
          }
          iVar3 = stbi__zbuild_huffman
                            (local_50,(stbi_uc *)(z_codelength.value + 0x11c),(int)local_60);
          if (iVar3 == 0) {
            return 0;
          }
          iVar3 = stbi__zbuild_huffman(local_48,lencodes + (long)(int)local_60 + -8,(int)local_40);
          if (iVar3 == 0) {
            return 0;
          }
        }
        pcVar10 = a->zout;
        while( true ) {
          while (iVar3 = stbi__zhuffman_decode(a,local_50), iVar3 < 0x100) {
            if (iVar3 < 0) goto LAB_0011dc50;
            if (a->zout_end <= pcVar10) {
              iVar9 = stbi__zexpand(a,pcVar10,1);
              if (iVar9 == 0) {
                return 0;
              }
              pcVar10 = a->zout;
            }
            *pcVar10 = (char)iVar3;
            pcVar10 = pcVar10 + 1;
          }
          if (iVar3 == 0x100) break;
          uVar5 = (ulong)(iVar3 - 0x101);
          uVar1 = stbi__zlength_base[uVar5];
          if (0xffffffffffffffeb < uVar5 - 0x1c) {
            uVar2 = stbi__zreceive(a,stbi__zlength_extra[uVar5]);
            uVar1 = uVar1 + uVar2;
          }
          uVar2 = stbi__zhuffman_decode(a,local_48);
          if ((int)uVar2 < 0) {
LAB_0011dc50:
            stbi__g_failure_reason = "bad huffman code";
            goto LAB_0011dc85;
          }
          uVar5 = (ulong)uVar2;
          iVar3 = stbi__zdist_base[uVar5];
          if (0xffffffffffffffe5 < uVar5 - 0x1e) {
            uVar2 = stbi__zreceive(a,stbi__zdist_extra[uVar5]);
            iVar3 = iVar3 + uVar2;
          }
          if ((long)pcVar10 - (long)a->zout_start < (long)iVar3) {
            stbi__g_failure_reason = "bad dist";
            goto LAB_0011dc85;
          }
          if (a->zout_end < pcVar10 + (int)uVar1) {
            iVar9 = stbi__zexpand(a,pcVar10,uVar1);
            if (iVar9 == 0) {
              return 0;
            }
            pcVar10 = a->zout;
          }
          lVar6 = -(long)iVar3;
          if (iVar3 == 1) {
            if (uVar1 != 0) {
              memset(pcVar10,(uint)(byte)pcVar10[lVar6],(ulong)uVar1);
              pcVar10 = pcVar10 + (ulong)(uVar1 - 1) + 1;
            }
          }
          else {
            for (; uVar1 != 0; uVar1 = uVar1 - 1) {
              *pcVar10 = pcVar10[lVar6];
              pcVar10 = pcVar10 + 1;
            }
          }
        }
        a->zout = pcVar10;
      }
    } while (local_54 == 0);
    iVar3 = 1;
  }
  else {
    pbVar4 = a->zbuffer;
    uVar1 = 0;
    if (pbVar4 < a->zbuffer_end) {
      a->zbuffer = pbVar4 + 1;
      uVar2 = (uint)*pbVar4;
      pbVar4 = pbVar4 + 1;
    }
    else {
      uVar2 = 0;
    }
    if (pbVar4 < a->zbuffer_end) {
      a->zbuffer = pbVar4 + 1;
      uVar1 = (uint)*pbVar4;
    }
    if ((short)((uVar2 << 8 | uVar1) % 0x1f) == 0) {
      if ((uVar1 & 0x20) == 0) {
        if ((uVar2 & 0xf) == 8) goto LAB_0011d72b;
        stbi__g_failure_reason = "bad compression";
      }
      else {
        stbi__g_failure_reason = "no preset dict";
      }
    }
    else {
      stbi__g_failure_reason = "bad zlib header";
    }
LAB_0011dc85:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}